

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O2

void __thiscall Catch::TestCase::swap(TestCase *this,TestCase *other)

{
  SpecialProperties SVar1;
  ITestCase *pIVar2;
  
  pIVar2 = (this->test).m_p;
  (this->test).m_p = (other->test).m_p;
  (other->test).m_p = pIVar2;
  std::__cxx11::string::swap((string *)this);
  std::__cxx11::string::swap((string *)&(this->super_TestCaseInfo).className);
  std::__cxx11::string::swap((string *)&(this->super_TestCaseInfo).description);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap(&(this->super_TestCaseInfo).tags._M_t,&(other->super_TestCaseInfo).tags._M_t);
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::swap(&(this->super_TestCaseInfo).lcaseTags._M_t,&(other->super_TestCaseInfo).lcaseTags._M_t);
  std::__cxx11::string::swap((string *)&(this->super_TestCaseInfo).tagsAsString);
  SVar1 = (this->super_TestCaseInfo).properties;
  (this->super_TestCaseInfo).properties = (other->super_TestCaseInfo).properties;
  (other->super_TestCaseInfo).properties = SVar1;
  std::swap<Catch::SourceLineInfo>
            (&(this->super_TestCaseInfo).lineInfo,&(other->super_TestCaseInfo).lineInfo);
  return;
}

Assistant:

void TestCase::swap( TestCase& other ) {
        test.swap( other.test );
        name.swap( other.name );
        className.swap( other.className );
        description.swap( other.description );
        tags.swap( other.tags );
        lcaseTags.swap( other.lcaseTags );
        tagsAsString.swap( other.tagsAsString );
        std::swap( TestCaseInfo::properties, static_cast<TestCaseInfo&>( other ).properties );
        std::swap( lineInfo, other.lineInfo );
    }